

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomHeap.h
# Opt level: O0

char * __thiscall
Memory::CustomHeap::
CodePageAllocators<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::AllocPages
          (CodePageAllocators<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>
           *this,uint pages,void **pageSegment,bool canAllocInPreReservedHeapPageSegment,
          bool isAnyJittedCode,bool *isAllJITCodeInPreReservedRegion)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  char *local_38;
  char *address;
  bool *isAllJITCodeInPreReservedRegion_local;
  bool isAnyJittedCode_local;
  bool canAllocInPreReservedHeapPageSegment_local;
  void **pageSegment_local;
  uint pages_local;
  CodePageAllocators<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>
  *this_local;
  
  bVar2 = CCLock::IsLocked((CCLock *)this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/CustomHeap.h"
                       ,0xcb,"(this->cs.IsLocked())","this->cs.IsLocked()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  local_38 = (char *)0x0;
  if (((canAllocInPreReservedHeapPageSegment) &&
      (local_38 = PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                  ::AllocPages(&(this->preReservedHeapAllocator).
                                super_PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                               ,pages,(PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> **)
                                      pageSegment), local_38 == (char *)0x0)) &&
     ((DAT_01ec73ca & 1) != 0)) {
    Output::Trace(CustomHeapPhase,L"PRE-RESERVE: PreReserved Segment CANNOT be allocated \n");
  }
  if (local_38 == (char *)0x0) {
    if (isAnyJittedCode) {
      *isAllJITCodeInPreReservedRegion = false;
    }
    local_38 = PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
               ::AllocPages(&(this->pageAllocator).
                             super_PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                            ,pages,(PageSegmentBase<Memory::VirtualAllocWrapper> **)pageSegment);
  }
  else if ((DAT_01ec73ca & 1) != 0) {
    Output::Trace(CustomHeapPhase,L"PRE-RESERVE: Allocing new page in PreReserved Segment \n");
  }
  return local_38;
}

Assistant:

char * AllocPages(DECLSPEC_GUARD_OVERFLOW uint pages, void ** pageSegment, bool canAllocInPreReservedHeapPageSegment, bool isAnyJittedCode, bool * isAllJITCodeInPreReservedRegion)
    {
        Assert(this->cs.IsLocked());
        char * address = nullptr;
        if (canAllocInPreReservedHeapPageSegment)
        {
            address = this->preReservedHeapAllocator.AllocPages(pages, (PageSegmentBase<TPreReservedAlloc>**)pageSegment);

            if (address == nullptr)
            {
                VerboseHeapTrace(_u("PRE-RESERVE: PreReserved Segment CANNOT be allocated \n"));
            }
        }

        if (address == nullptr)    // if no space in Pre-reserved Page Segment, then allocate in regular ones.
        {
            if (isAnyJittedCode)
            {
                *isAllJITCodeInPreReservedRegion = false;
            }
            address = this->pageAllocator.AllocPages(pages, (PageSegmentBase<TAlloc>**)pageSegment);
        }
        else
        {
            VerboseHeapTrace(_u("PRE-RESERVE: Allocing new page in PreReserved Segment \n"));
        }

        return address;
    }